

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

error_code __thiscall
anon_unknown.dwarf_35995e::DirectoryContentsTask::getContents
          (DirectoryContentsTask *this,StringRef path,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenames)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar1;
  long lVar2;
  Child __ptr;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *extraout_RAX;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *extraout_RAX_00;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *extraout_RAX_01;
  undefined8 uVar7;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_01;
  error_category *extraout_RDX;
  error_category *extraout_RDX_00;
  error_category *extraout_RDX_01;
  error_category *extraout_RDX_02;
  error_category *extraout_RDX_03;
  error_category *peVar8;
  error_category *extraout_RDX_04;
  error_category *extraout_RDX_05;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __i;
  long lVar9;
  error_code eVar10;
  StringRef SVar11;
  error_code ec;
  SmallString<256U> resolvedPath;
  directory_iterator local_1b0;
  error_code local_198;
  StringRef local_188;
  directory_iterator local_178;
  Child local_158;
  ulong local_150;
  undefined1 local_148;
  undefined7 uStack_147;
  byte local_128;
  Twine local_48;
  
  this_01 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)path.Length;
  local_188.Length = (size_t)path.Data;
  local_198._M_value = 0;
  local_188.Data = (char *)this;
  local_198._M_cat = (error_category *)std::_V2::system_category();
  llvm::Twine::Twine((Twine *)&local_158,&local_188);
  uVar7 = 0;
  llvm::sys::fs::directory_iterator::directory_iterator
            (&local_1b0,(Twine *)&local_158,&local_198,false);
  local_178.State.
  super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_178.State.
  super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_178.FollowSymlinks = true;
  local_178._17_7_ = 0;
  bVar3 = llvm::sys::fs::directory_iterator::operator==(&local_1b0,&local_178);
  peVar8 = extraout_RDX;
  if ((!bVar3) && (local_198._M_value == 0)) {
    this_00 = &local_1b0.State.
               super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    do {
      llvm::sys::fs::directory_entry::status
                ((ErrorOr<llvm::sys::fs::basic_file_status> *)&local_158,
                 &(local_1b0.State.
                   super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->CurrentEntry);
      if ((local_128 & 1) != 0) {
        __assert_fail("!HasError && \"Cannot get value when an error exists!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/ErrorOr.h"
                      ,0xf4,
                      "storage_type *llvm::ErrorOr<llvm::sys::fs::basic_file_status>::getStorage() [T = llvm::sys::fs::basic_file_status]"
                     );
      }
      bVar3 = llvm::sys::fs::is_symlink_file((basic_file_status *)&local_158);
      if (bVar3) {
        local_150 = 0x10000000000;
        local_158.twine = (Twine *)&local_148;
        llvm::Twine::Twine(&local_48,
                           &((local_1b0.State.
                              super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->CurrentEntry).Path);
        eVar10 = llvm::sys::fs::real_path(&local_48,(SmallVectorImpl<char> *)&local_158,false);
        __ptr = local_158;
        if (((eVar10._M_value == 0) &&
            (pcVar5 = (char *)(local_150 & 0xffffffff), pcVar5 <= local_188.Length)) &&
           ((pcVar5 == (char *)0x0 ||
            (iVar4 = bcmp(local_188.Data,local_158.twine,(size_t)pcVar5), iVar4 == 0)))) {
          bVar3 = false;
        }
        else {
          bVar3 = true;
        }
        if (__ptr.twine != (Twine *)&local_148) {
          free(__ptr.twine);
        }
        if (bVar3) goto LAB_0019c4ee;
      }
      else {
LAB_0019c4ee:
        SVar11.Length = 2;
        SVar11.Data = (char *)((local_1b0.State.
                                super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->CurrentEntry).Path._M_string_length;
        SVar11 = llvm::sys::path::filename
                           ((path *)((local_1b0.State.
                                      super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->CurrentEntry).Path._M_dataplus._M_p,SVar11,
                            (Style)uVar7);
        pcVar5 = SVar11.Data;
        if (pcVar5 == (char *)0x0) {
          local_150 = 0;
          local_148 = 0;
          local_158.twine = (Twine *)&local_148;
        }
        else {
          local_158.twine = (Twine *)&local_148;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_158,pcVar5,pcVar5 + SVar11.Length);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_158);
        if (local_158.twine != (Twine *)&local_148) {
          operator_delete(local_158.twine,CONCAT71(uStack_147,local_148) + 1);
        }
      }
      eVar10 = llvm::sys::fs::detail::directory_iterator_increment
                         (local_1b0.State.
                          super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr);
      local_198._M_cat = eVar10._M_cat;
      local_198._M_value = eVar10._M_value;
      llvm::sys::fs::directory_iterator::update_error_code_for_current_entry(&local_1b0,&local_198);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(this_00,this_00);
      bVar3 = llvm::sys::fs::directory_iterator::operator==(&local_1b0,&local_178);
      peVar8 = extraout_RDX_00;
    } while ((!bVar3) && (local_198._M_value == 0));
  }
  if (local_178.State.
      super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_178.State.
               super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    peVar8 = extraout_RDX_01;
  }
  if (local_1b0.State.
      super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b0.State.
               super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    peVar8 = extraout_RDX_02;
  }
  lVar1 = *(long *)this_01;
  lVar2 = *(long *)(this_01 + 8);
  if (lVar1 != lVar2) {
    uVar6 = lVar2 - lVar1 >> 5;
    lVar9 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::DirectoryContentsTask::getContents(llvm::StringRef,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_>>
              (lVar1,lVar2,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar2 - lVar1 < 0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::DirectoryContentsTask::getContents(llvm::StringRef,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_>>
                (lVar1,lVar2);
      this_01 = extraout_RAX_01;
      peVar8 = extraout_RDX_05;
    }
    else {
      lVar9 = lVar1 + 0x200;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::DirectoryContentsTask::getContents(llvm::StringRef,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_>>
                (lVar1,lVar9);
      this_01 = extraout_RAX;
      peVar8 = extraout_RDX_03;
      for (; lVar9 != lVar2; lVar9 = lVar9 + 0x20) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::DirectoryContentsTask::getContents(llvm::StringRef,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_>>
                  (lVar9);
        this_01 = extraout_RAX_00;
        peVar8 = extraout_RDX_04;
      }
    }
  }
  eVar10._M_cat = peVar8;
  eVar10._0_8_ = this_01;
  return eVar10;
}

Assistant:

static std::error_code getContents(StringRef path, std::vector<std::string>& filenames) {
    // Get the list of files in the directory.
    // FIXME: This is not going through the filesystem object. Indeed the fs
    // object does not currently support directory listing/iteration, but
    // probably should so that clients may override it.
    //
    // Exit the loop if we encounter any errors, to prevent infinitely looping
    // over an invalid directory in some circumstances. rdar://101717159
    std::error_code ec;
    for (auto it = llvm::sys::fs::directory_iterator(path, ec, /*follow_symlinks */false),
         end = llvm::sys::fs::directory_iterator(); it != end && !ec;
         it = it.increment(ec)) {
      // If this is a symlink to a parent directory, exclude it from results so we don't get stuck in a loop.
      if (llvm::sys::fs::is_symlink_file(*it->status())) {
        SmallString<256> resolvedPath;
        if (!llvm::sys::fs::real_path(it->path(), resolvedPath)) {
          if (path.startswith(resolvedPath)) {
            continue;
          }
        }
      }
      filenames.push_back(llvm::sys::path::filename(it->path()));
    }

    // Order the filenames.
    std::sort(filenames.begin(), filenames.end(),
              [](const std::string& a, const std::string& b) {
                return a < b;
              });

    return ec;
  }